

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

bool __thiscall
mjs::object::do_redefine_own_property(object *this,string *name,value *val,property_attribute attr)

{
  uint __line;
  bool bVar1;
  property_attribute a;
  property *this_00;
  gc_vector<mjs::object::property> *this_01;
  char *__assertion;
  wstring_view key;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar2;
  property_attribute attr_local;
  wstring_view local_38;
  
  attr_local = attr;
  key = string::view(name);
  pVar2 = find(this,key);
  this_00 = pVar2.first;
  if (this_00 == (property *)0x0) {
    local_38 = string::view(name);
    a = (*this->_vptr_object[6])(this);
    bVar1 = is_valid(a);
    if (bVar1) {
      __assertion = "!is_valid(own_property_attributes(name.view()))";
      __line = 0x66;
      goto LAB_00144af8;
    }
    this_01 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                        (&this->properties_,this->heap_);
    gc_vector<mjs::object::property>::
    emplace_back<mjs::string_const&,mjs::value_const&,mjs::property_attribute&>
              (this_01,name,val,&attr_local);
  }
  else {
    bVar1 = has_attributes(attr,accessor);
    if (bVar1) {
      __assertion = "!has_attributes(attr, property_attribute::accessor)";
      __line = 0x61;
LAB_00144af8:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                    ,__line,
                    "virtual bool mjs::object::do_redefine_own_property(const string &, const value &, property_attribute)"
                   );
    }
    this_00->attributes_ = attr;
    property::raw_put(this_00,val);
  }
  return true;
}

Assistant:

bool object::do_redefine_own_property(const string& name, const value& val, property_attribute attr) {
    if (auto it = find(name.view()).first) {
        assert(!has_attributes(attr, property_attribute::accessor));
        it->attributes(attr);
        it->raw_put(val);
        return true;
    }
    assert(!is_valid(own_property_attributes(name.view())));
    properties_.dereference(heap()).emplace_back(name, val, attr);
    return true;
}